

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

size_t allocate_tmp_space(estate s,FFSBuffer buf,size_t length,int req_alignment,
                         size_t *tmp_data_loc)

{
  uint uVar1;
  ssize_t sVar2;
  long lVar3;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  ssize_t *in_R8;
  size_t msg_offset;
  size_t tmp_data;
  int pad;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  size_t local_8;
  
  uVar1 = in_ECX - *(int *)(in_RDI + 8) & in_ECX - 1U;
  ensure_writev_room((estate)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
  sVar2 = add_to_tmp_buffer((FFSBuffer)CONCAT44(uVar1,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc0);
  if (sVar2 == -1) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (uVar1 != 0) {
      if (*(long *)(*(long *)(in_RDI + 0x18) + (long)(*(int *)(in_RDI + 0x14) + -1) * 0x18) == 0) {
        memset((void *)(*in_RSI + sVar2),0,(long)(int)uVar1);
        sVar2 = (int)uVar1 + sVar2;
        lVar3 = *(long *)(in_RDI + 0x18) + (long)(*(int *)(in_RDI + 0x14) + -1) * 0x18;
        *(long *)(lVar3 + 0x10) = (long)(int)uVar1 + *(long *)(lVar3 + 0x10);
      }
      else {
        *(long *)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDI + 0x14) * 0x18 + 0x10) =
             (long)(int)uVar1;
        *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDI + 0x14) * 0x18 + 8) = 0;
        *(char **)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDI + 0x14) * 0x18) = zeroes;
        *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
      }
    }
    local_8 = *(long *)(in_RDI + 8) + (long)(int)uVar1;
    if (in_R8 != (ssize_t *)0x0) {
      *in_R8 = sVar2;
    }
    *(long *)(in_RDI + 8) = in_RDX + (int)uVar1 + *(long *)(in_RDI + 8);
  }
  return local_8;
}

Assistant:

size_t
allocate_tmp_space(estate s, FFSBuffer buf, size_t length, int req_alignment, size_t *tmp_data_loc)
{
    int pad = (req_alignment - s->output_len) & (req_alignment -1);  /*  only works if req_align is power of two */
    size_t tmp_data, msg_offset;
    switch (req_alignment) {
    case 1: case 2: case 4: case 8: case 16: break;
    default:
	assert(0);
    }
    ensure_writev_room(s, 2);
    tmp_data = add_to_tmp_buffer(buf, length + pad);
    if (tmp_data == (size_t)-1) return (size_t) -1;
    if (pad != 0) {
	if (s->iovec[s->iovcnt-1].iov_base == NULL) {
	    /* last was tmp too */
	    memset((char*)buf->tmp_buffer + tmp_data, 0, pad);	/* zero pad */
	    tmp_data += pad;
	    s->iovec[s->iovcnt-1].iov_len += pad;
	} else {
	    s->iovec[s->iovcnt].iov_len = pad;
	    s->iovec[s->iovcnt].iov_offset = 0;
	    s->iovec[s->iovcnt].iov_base = zeroes;
	    s->iovcnt++;
	}
    }
    msg_offset = s->output_len + pad;
    if (tmp_data_loc) *tmp_data_loc = tmp_data;
    s->output_len += length + pad;
    return msg_offset;
}